

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O3

bool __thiscall
test_uintwide_t_n_binary_ops_template<12288U,_unsigned_int,_void>::test_binary_mod
          (test_uintwide_t_n_binary_ops_template<12288U,_unsigned_int,_void> *this)

{
  anon_class_32_4_006e9c57 parallel_function;
  uint uVar1;
  random_generator_type *prVar2;
  size_t __i;
  long lVar3;
  atomic_flag test_lock;
  bool result_is_ok;
  uniform_int_distribution<int> dis;
  atomic_flag local_3a;
  undefined1 local_39;
  undefined1 *local_38;
  test_uintwide_t_n_binary_ops_template<12288U,_unsigned_int,_void> *ptStack_30;
  undefined8 *local_28;
  atomic_flag *paStack_20;
  undefined8 local_18;
  
  local_3a.super___atomic_flag_base._M_i = (__atomic_flag_base)false;
  prVar2 = test_uintwide_t_n_binary_ops_base::my_gen();
  uVar1 = util::util_pseudorandom_time_point_seed::value<unsigned_int>();
  prVar2->_M_x[0] = uVar1;
  lVar3 = 1;
  do {
    uVar1 = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + (int)lVar3;
    prVar2->_M_x[lVar3] = uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  prVar2->_M_p = 0x270;
  local_28 = &local_18;
  local_18 = 0x2fff00000001;
  local_38 = &local_39;
  local_39 = 1;
  paStack_20 = &local_3a;
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)this;
  parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)local_38;
  parallel_function.distribution = (distribution_type *)local_28;
  parallel_function.rnd_lock = paStack_20;
  ptStack_30 = this;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<12288u,unsigned_int,void>::test_binary_mod()const::_lambda(unsigned_long)_1_>
            (0,(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
               number_of_cases,parallel_function);
  return (bool)local_39;
}

Assistant:

WIDE_INTEGER_NODISCARD auto test_binary_mod() const -> bool
    {
      std::atomic_flag test_lock = ATOMIC_FLAG_INIT;

      my_gen().seed(util::util_pseudorandom_time_point_seed::value<typename random_generator_type::result_type>());
      std::uniform_int_distribution<> dis(1, static_cast<int>(digits2 - 1U));

      bool result_is_ok = true;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        size(),
        [&result_is_ok, this, &dis, &test_lock](std::size_t i)
        {
          while(test_lock.test_and_set()) { ; }
          const auto right_shift_amount = static_cast<std::size_t>(dis(my_gen()));
          test_lock.clear();

          const boost_uint_type c_boost = a_boost[i] % (std::max)(boost_uint_type(1U), boost_uint_type(b_boost[i] >> right_shift_amount));
          const local_uint_type c_local = a_local[i] % (std::max)(local_uint_type(1U), (b_local[i] >> right_shift_amount));

          const std::string str_boost = hexlexical_cast(c_boost);
          const std::string str_local = hexlexical_cast(c_local);

          while(test_lock.test_and_set()) { ; }
          result_is_ok = ((str_boost == str_local) && result_is_ok);
          test_lock.clear();
        }
      );

      return result_is_ok;
    }